

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O3

int Dice::roll(void)

{
  result_type rVar1;
  initializer_list<unsigned_int> __il;
  seed_seq seed;
  uniform_int_distribution<int> dist;
  mt19937 eng;
  random_device r;
  seed_seq local_2738;
  param_type local_2720;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2718;
  random_device local_1390;
  
  std::random_device::random_device(&local_1390);
  local_2718._M_x[0]._0_4_ = std::random_device::_M_getval();
  local_2718._M_x[0]._4_4_ = std::random_device::_M_getval();
  local_2718._M_x[1]._0_4_ = std::random_device::_M_getval();
  local_2718._M_x[1]._4_4_ = std::random_device::_M_getval();
  local_2718._M_x[2]._0_4_ = std::random_device::_M_getval();
  local_2718._M_x[2]._4_4_ = std::random_device::_M_getval();
  local_2718._M_x[3]._0_4_ = std::random_device::_M_getval();
  local_2718._M_x[3]._4_4_ = std::random_device::_M_getval();
  __il._M_len = 8;
  __il._M_array = (iterator)&local_2718;
  std::seed_seq::seed_seq<unsigned_int,void>(&local_2738,__il);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed<std::seed_seq>(&local_2718,&local_2738);
  local_2720._M_a = 1;
  local_2720._M_b = 6;
  rVar1 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_2720,&local_2718,&local_2720);
  if (local_2738._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2738._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2738._M_v.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2738._M_v.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::random_device::_M_fini();
  return rVar1;
}

Assistant:

int Dice::roll() {
    std::random_device r;
    std::seed_seq seed{r(), r(), r(), r(), r(), r(), r(), r()};
    std::mt19937 eng{seed};
    std::uniform_int_distribution<> dist(1, 6);

    int roll = dist(eng);

    return roll;
}